

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_NodeIsExorType(Fraig_Node_t *pNode)

{
  int iVar1;
  Fraig_Node_t *p;
  int *piVar2;
  int *piVar3;
  bool local_29;
  Fraig_Node_t *pNode2;
  Fraig_Node_t *pNode1;
  Fraig_Node_t *pNode_local;
  
  p = (Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe);
  iVar1 = Fraig_NodeIsAnd(p);
  if (iVar1 == 0) {
    pNode_local._4_4_ = 0;
  }
  else {
    iVar1 = Fraig_NodeIsAnd(p->p1);
    if ((iVar1 == 0) || (((ulong)p->p1 & 1) == 0)) {
      pNode_local._4_4_ = 0;
    }
    else {
      iVar1 = Fraig_NodeIsAnd(p->p2);
      if ((iVar1 == 0) || (((ulong)p->p2 & 1) == 0)) {
        pNode_local._4_4_ = 0;
      }
      else {
        piVar2 = (int *)((ulong)p->p1 & 0xfffffffffffffffe);
        piVar3 = (int *)((ulong)p->p2 & 0xfffffffffffffffe);
        if (*piVar3 <= *piVar2) {
          __assert_fail("pNode1->Num < pNode2->Num",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigUtil.c"
                        ,0x23e,"int Fraig_NodeIsExorType(Fraig_Node_t *)");
        }
        local_29 = false;
        if (*(ulong *)(piVar2 + 8) == (*(ulong *)(piVar3 + 8) ^ 1)) {
          local_29 = *(ulong *)(piVar2 + 10) == (*(ulong *)(piVar3 + 10) ^ 1);
        }
        pNode_local._4_4_ = (uint)local_29;
      }
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Fraig_NodeIsExorType( Fraig_Node_t * pNode )
{
    Fraig_Node_t * pNode1, * pNode2;
    // make the node regular (it does not matter for EXOR/NEXOR)
    pNode = Fraig_Regular(pNode);
    // if the node or its children are not ANDs or not compl, this cannot be EXOR type
    if ( !Fraig_NodeIsAnd(pNode) )
        return 0;
    if ( !Fraig_NodeIsAnd(pNode->p1) || !Fraig_IsComplement(pNode->p1) )
        return 0;
    if ( !Fraig_NodeIsAnd(pNode->p2) || !Fraig_IsComplement(pNode->p2) )
        return 0;

    // get children
    pNode1 = Fraig_Regular(pNode->p1);
    pNode2 = Fraig_Regular(pNode->p2);
    assert( pNode1->Num < pNode2->Num );

    // compare grandchildren
    return pNode1->p1 == Fraig_Not(pNode2->p1) && pNode1->p2 == Fraig_Not(pNode2->p2);
}